

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tmove(lua_State *L)

{
  int iVar1;
  int arg;
  lua_Integer lVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  long lVar5;
  long local_40;
  lua_Integer i;
  lua_Integer n;
  int tt;
  lua_Integer t;
  lua_Integer e;
  lua_Integer f;
  lua_State *L_local;
  
  lVar2 = luaL_checkinteger(L,2);
  lVar3 = luaL_checkinteger(L,3);
  lVar4 = luaL_checkinteger(L,4);
  iVar1 = lua_type(L,5);
  arg = 1;
  if (0 < iVar1) {
    arg = 5;
  }
  checktab(L,1,1);
  checktab(L,arg,2);
  if (lVar2 <= lVar3) {
    if ((lVar2 < 1) && (lVar2 + 0x7fffffffffffffff <= lVar3)) {
      luaL_argerror(L,3,"too many elements to move");
    }
    local_40 = lVar3 - lVar2;
    lVar5 = local_40 + 1;
    if (-0x8000000000000000 - lVar5 < lVar4) {
      luaL_argerror(L,4,"destination wrap around");
    }
    if (((lVar3 < lVar4) || (lVar4 <= lVar2)) ||
       ((arg != 1 && (iVar1 = lua_compare(L,1,arg,0), iVar1 == 0)))) {
      for (local_40 = 0; local_40 < lVar5; local_40 = local_40 + 1) {
        lua_geti(L,1,lVar2 + local_40);
        lua_seti(L,arg,lVar4 + local_40);
      }
    }
    else {
      for (; -1 < local_40; local_40 = local_40 + -1) {
        lua_geti(L,1,lVar2 + local_40);
        lua_seti(L,arg,lVar4 + local_40);
      }
    }
  }
  lua_pushvalue(L,arg);
  return 1;
}

Assistant:

static int tmove(lua_State *L) {
    lua_Integer f = luaL_checkinteger(L, 2);
    lua_Integer e = luaL_checkinteger(L, 3);
    lua_Integer t = luaL_checkinteger(L, 4);
    int tt = !lua_isnoneornil(L, 5) ? 5 : 1;  /* destination table */
    checktab(L, 1, TAB_R);
    checktab(L, tt, TAB_W);
    if (e >= f) {  /* otherwise, nothing to move */
        lua_Integer n, i;
        luaL_argcheck(L, f > 0 || e < LUA_MAXINTEGER + f, 3,
                      "too many elements to move");
        n = e - f + 1;  /* number of elements to move */
        luaL_argcheck(L, t <= LUA_MAXINTEGER - n + 1, 4,
                      "destination wrap around");
        if (t > e || t <= f || (tt != 1 && !lua_compare(L, 1, tt, LUA_OPEQ))) {
            for (i = 0; i < n; i++) {
                lua_geti(L, 1, f + i);
                lua_seti(L, tt, t + i);
            }
        } else {
            for (i = n - 1; i >= 0; i--) {
                lua_geti(L, 1, f + i);
                lua_seti(L, tt, t + i);
            }
        }
    }
    lua_pushvalue(L, tt);  /* return destination table */
    return 1;
}